

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
sophia_interface::LUKFDI
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,sophia_interface *this,int KFL1
          ,int KFL2)

{
  bool bVar1;
  double dVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  sophia_interface *psVar6;
  uint uVar7;
  double *pdVar8;
  uint *puVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  iterator iVar14;
  sophia_interface *psVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int *piVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  sophia_interface *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  double local_180;
  ulong local_178;
  ulong local_170;
  double local_168;
  double local_160;
  double local_158;
  ulong local_150;
  double local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  sophia_interface *local_128;
  double local_120;
  ulong local_118;
  double local_110;
  ulong local_108;
  int local_100;
  int local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  int local_e0;
  int local_dc;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  uint local_8c;
  undefined1 local_88 [16];
  double local_78;
  double local_70;
  sophia_interface *local_68;
  uint local_60;
  uint local_5c;
  double local_58;
  char local_4e;
  byte local_4d;
  int local_4c;
  uint local_48;
  int local_44;
  double local_40;
  uint local_38;
  uint local_34 [2];
  int KF;
  
  local_38 = 0;
  local_34[0] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar22 = (ulong)(uint)-KFL1;
  if (0 < KFL1) {
    uVar22 = (ulong)(uint)KFL1;
  }
  local_48 = (uint)uVar22;
  local_98 = (ulong)(uint)-KFL2;
  if (0 < KFL2) {
    local_98 = (ulong)(uint)KFL2;
  }
  local_44 = KFL1;
  if (KFL1 == 0) {
    iVar14._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current !=
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00129664;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)&local_38);
  }
  else {
    local_f8 = (uint)local_98;
    if (KFL2 == 0) {
LAB_00129691:
      uVar20 = 1;
      local_a8 = 0;
      local_a0 = 0;
      local_108 = 0;
      local_140 = 0;
      local_8c = 0;
      if (MSTJ[0xe] == 1) {
        uVar20 = 0xffffffff;
        if (local_48 < 7) {
          uVar20 = local_48;
        }
        uVar16 = (int)(uVar22 / 1000) + (int)(uVar22 / 10000) * -10;
        uVar21 = (int)(uVar22 / 100) + (int)(uVar22 / 1000) * -10;
        local_a0 = (ulong)uVar21;
        if ((uVar21 - 1 | uVar16 - 1) < 4) {
          iVar11 = ~((int)(uVar22 / 10) * 10) + local_48;
          uVar20 = (uVar16 - 2) * uVar16 + ((int)(char)iVar11 - (iVar11 >> 0x1f) >> 1) + uVar21 * 2
                   + 6;
        }
        uVar20 = uVar20 - (uVar16 == uVar21 && uVar16 - 1 < 4);
        local_140 = (ulong)uVar20;
        local_108 = (ulong)uVar16;
        if (local_48 < 7) {
          local_108 = uVar22;
        }
        if (KFL2 == 0) {
          local_8c = 0;
        }
        else {
          local_8c = 0xffffffff;
          if (local_f8 < 7) {
            local_8c = local_f8;
          }
          iVar11 = (int)(local_98 / 1000) + (int)(local_98 / 10000) * -10;
          iVar12 = (int)(local_98 / 100) + (int)(local_98 / 1000) * -10;
          if (iVar12 - 1U < 4 && iVar11 - 1U < 4) {
            iVar17 = ~((int)(local_98 / 10) * 10) + local_f8;
            local_8c = (iVar11 + -2) * iVar11 +
                       ((int)(char)iVar17 - (iVar17 >> 0x1f) >> 1) + iVar12 * 2 + 6;
          }
          local_8c = local_8c - (iVar11 == iVar12 && iVar11 - 1U < 4);
        }
        uVar20 = (uVar20 | local_8c) >> 0x1f;
      }
      local_f0 = 0;
      if (local_48 < 0x2711) {
        local_f0 = local_48;
      }
      local_ec = 0;
      if (local_f8 - 0xb < 0x2706) {
        local_ec = local_f8;
      }
      local_4e = local_48 < 0xb && KFL2 == 0;
      uVar16 = (int)(uVar22 / 1000) + (int)(uVar22 / 10000) * -10;
      psVar15 = (sophia_interface *)(ulong)uVar16;
      uVar21 = (int)(uVar22 / 100) + (int)(uVar22 / 1000) * -10;
      local_150 = (ulong)uVar21;
      local_f4 = local_48 + (int)(uVar22 / 10) * -10;
      local_178 = (ulong)(uint)((int)(local_98 / 1000) + (int)(local_98 / 10000) * -10);
      local_170 = (ulong)(uint)((int)(local_98 / 100) + (int)(local_98 / 1000) * -10);
      local_f8 = local_f8 + (int)(local_98 / 10) * -10;
      local_60 = ~KFL1 >> 0x1f | 1;
      local_5c = KFL1 >> 0x1f | 1;
      local_100 = uVar21 - uVar16;
      iVar11 = (int)local_140;
      local_e8 = 0x16;
      if (local_8c != 0) {
        local_e8 = local_8c;
      }
      local_4d = local_8c == 0 && 6 < iVar11;
      local_e4 = local_8c + (local_8c == 0);
      local_e0 = (iVar11 * -2 + 0xd) * KFL1;
      local_dc = (iVar11 * 2 + -0xd) * KFL1;
      local_130 = (ulong)(uint)(iVar11 * 0x50);
      local_118 = (ulong)(iVar11 * 0x50 + 0x77);
      local_138 = (ulong)(iVar11 * 0x50 + 0x78);
      local_fc = uVar16 + uVar21;
      local_128 = psVar15;
      local_68 = (sophia_interface *)__return_storage_ptr__;
      local_4c = KFL2;
LAB_00129a66:
      if (uVar20 != 0) {
        local_b0 = PARJ[3] * 3.0;
        local_70 = PARJ[2];
        if (MSTJ[0xb] < 2) {
          local_c0 = 0.0;
          local_c8 = 0.0;
          local_b8 = 0.0;
          local_d0 = 0.0;
          local_168 = 0.0;
          local_d8 = 0.0;
          local_160 = 0.0;
          dVar27 = PARJ[1];
        }
        else {
          local_40 = PARJ[1];
          if (PARJ[2] < 0.0) {
            local_d8 = sqrt(PARJ[2]);
          }
          else {
            local_d8 = SQRT(PARJ[2]);
          }
          if (PARJ[3] < 0.0) {
            dVar27 = sqrt(PARJ[3]);
          }
          else {
            dVar27 = SQRT(PARJ[3]);
          }
          local_168 = 1.0 / (dVar27 * 3.0);
          dVar27 = local_168 + 1.0;
          local_b8 = ((local_40 * local_d8 * PARJ[6] + 1.0) * dVar27 + 2.0) * PARJ[4];
          local_c8 = (PARJ[5] * dVar27 + local_40 * local_d8 * PARJ[5] * PARJ[6]) * PARJ[4] +
                     (PARJ[6] * local_b8) / (local_d8 + local_d8);
          local_c0 = (local_40 * PARJ[6] + dVar27 / local_d8) *
                     (PARJ[4] + PARJ[4]) * PARJ[5] * PARJ[6];
          local_88._0_8_ = local_b8;
          local_88._8_8_ = local_c8;
          local_78 = local_c0;
          lVar4 = 8;
          pdVar8 = (double *)local_88;
          do {
            if (*pdVar8 <= *(double *)(local_88 + lVar4) && *(double *)(local_88 + lVar4) != *pdVar8
               ) {
              pdVar8 = (double *)(local_88 + lVar4);
            }
            lVar4 = lVar4 + 8;
          } while (lVar4 != 0x18);
          local_160 = *pdVar8;
          local_d0 = PARJ[6] / (PARJ[5] * local_d8 + PARJ[6]);
          local_b0 = (local_b0 * (local_160 + 1.0)) / (local_160 / (local_168 * 3.0) + 1.0);
          dVar27 = local_40;
        }
        local_120 = local_168 * 3.0;
        local_110 = dVar27 + 2.0;
        local_70 = local_70 * dVar27 + 2.0;
        local_158 = local_160 / local_120 + 1.0;
        local_160 = local_160 + 1.0;
        local_d8 = local_d8 * dVar27;
        local_168 = local_168 + 1.0;
        local_180 = local_168;
        if (local_168 <= 2.0) {
          local_180 = 2.0;
        }
        local_148 = 1.0 / local_168;
        local_168 = local_168 / local_180;
        local_180 = 2.0 / local_180;
        do {
          local_58 = (double)CONCAT44(local_58._4_4_,2);
          uVar20 = local_f0;
          if ((uint)uVar22 < 0xb) {
            local_58._0_4_ = 0;
            iVar11 = local_58._0_4_;
            local_58._0_4_ = 0;
            if ((KFL2 == 0) && (iVar11 = local_58._0_4_, 0 < MSTJ[0xb])) {
              local_40 = PARJ[0] + 1.0;
              local_58._0_4_ = 0;
              dVar27 = RLU(psVar15,false);
              iVar11 = local_58._0_4_;
              if (1.0 < dVar27 * local_40) {
                local_58._0_4_ = 1;
                iVar11 = local_58._0_4_;
              }
            }
            local_58._0_4_ = iVar11;
            if (10 < (uint)local_98) {
              local_58._0_4_ = 2;
            }
            uVar20 = local_ec;
          }
          if ((uVar20 == 0) || (MSTJ[0xb] < 2)) {
LAB_00129f09:
            psVar6 = local_128;
            if (local_58._0_4_ < 1) {
              if (local_58._0_4_ == 0) {
                if (local_4c == 0) {
                  dVar27 = RLU(psVar15,false);
                  local_38 = ~(int)(dVar27 * local_110);
                  if (local_44 < 1) {
                    local_38 = (int)(dVar27 * local_110) + 1;
                  }
                }
                uVar20 = -local_38;
                if (0 < (int)local_38) {
                  uVar20 = local_38;
                }
                uVar20 = uVar20 + (uint)local_98;
                uVar21 = uVar20;
                uVar16 = local_48;
                if (uVar20 < local_48) {
                  uVar21 = local_48;
                  uVar16 = uVar20;
                }
                uVar10 = local_5c;
                if (local_48 < uVar20) {
                  uVar10 = local_60;
                }
              }
              else {
LAB_0012a28e:
                do {
                  dVar27 = RLU(psVar15,false);
                  uVar16 = (int)(dVar27 + 0.5) * local_100 + (int)psVar6;
                  uVar7 = local_fc - uVar16;
                  uVar20 = uVar16;
                  if (((uVar16 != 3) || (dVar27 = RLU(psVar15,false), dVar27 <= local_d0)) &&
                     ((uVar7 != 3 || (dVar27 = RLU(psVar15,false), local_d0 <= dVar27)))) {
                    uVar20 = uVar7;
                    uVar7 = uVar16;
                  }
                  local_40 = PARJ[6] * local_d8;
                  dVar27 = RLU(psVar15,false);
                  iVar11 = (int)((local_40 + 2.0) * dVar27);
                  uVar10 = iVar11 + 1;
                  if (uVar20 != uVar10) {
                    dVar27 = RLU(psVar15,false);
                    if (local_168 < dVar27) goto LAB_0012a28e;
                    if (uVar20 != uVar10) goto LAB_0012a36b;
                  }
                  dVar27 = RLU(psVar15,false);
                } while (local_180 < dVar27);
                iVar12 = 3;
                if (uVar20 != uVar10) {
LAB_0012a36b:
                  dVar27 = RLU(psVar15,false);
                  iVar12 = (int)(dVar27 + local_148) * 2 + 1;
                }
                uVar16 = uVar10;
                if ((int)uVar10 < (int)uVar20) {
                  uVar16 = uVar20;
                }
                if ((int)uVar10 < (int)uVar20) {
                  uVar20 = uVar10;
                }
                iVar17 = uVar20 * 100 + uVar16 * 1000;
                local_38 = iVar12 + 10000 + iVar17;
                if (0 < local_44) {
                  local_38 = (-10000 - iVar17) - iVar12;
                }
                uVar16 = uVar10;
                uVar21 = uVar7;
                if ((int)uVar7 <= (int)uVar10) {
                  uVar16 = uVar7;
                  uVar21 = uVar10;
                }
                uVar10 = local_60;
                if (iVar11 < (int)uVar7) {
                  uVar10 = local_5c;
                }
              }
              uVar20 = 0;
              if ((int)uVar21 < 3) {
                local_40 = PARJ[10];
                dVar27 = RLU(psVar15,false);
                uVar20 = (uint)(dVar27 + local_40);
              }
              if (uVar21 == 3) {
                local_40 = PARJ[0xb];
                dVar27 = RLU(psVar15,false);
                uVar20 = (uint)(dVar27 + local_40);
              }
              if (3 < (int)uVar21) {
                local_40 = PARJ[0xc];
                dVar27 = RLU(psVar15,false);
                uVar20 = (uint)(dVar27 + local_40);
              }
              if ((uVar20 != 0) || (PARJ[0xd] <= 0.0)) {
                if ((uVar20 == 1) && (uVar20 = 1, 0.0 < PARJ[0xe] + PARJ[0xf] + PARJ[0x10])) {
                  dVar27 = RLU(psVar15,false);
                  if (dVar27 < PARJ[0xe]) {
                    uVar20 = (uint)(dVar27 < PARJ[0xe]) * 2 + 1;
                  }
                  else {
                    uVar20 = 1;
                    if (dVar27 < PARJ[0xf] + PARJ[0xe]) {
                      uVar20 = 4;
                    }
                  }
                  if ((uVar20 == 1) && (uVar20 = 1, dVar27 < PARJ[0xe] + PARJ[0xf] + PARJ[0x10])) {
                    uVar20 = 5;
                  }
                }
              }
              else {
                uVar20 = 0;
                dVar27 = RLU(psVar15,false);
                if (dVar27 < PARJ[0xd]) {
                  uVar20 = 2;
                }
              }
              iVar11 = (uVar20 != 3) + 1 + (uint)(uVar20 != 3);
              if (uVar20 == 0) {
                iVar11 = 1;
              }
              if (uVar20 == 5) {
                iVar11 = 5;
              }
              if (uVar21 == uVar16) {
                dVar27 = RLU(psVar15,false);
                if ((int)uVar21 < 4) {
                  lVar4 = (long)(int)(uVar21 * 2 + uVar20 * 10);
                  local_34[0] = ((int)(dVar27 + PMAS[3][lVar4 + 499]) +
                                (int)(PMAS[3][lVar4 + 0x1f2] + dVar27)) * 0x6e + iVar11 + 0x6e;
                }
                else {
                  local_34[0] = iVar11 + uVar21 * 0x6e;
                }
              }
              else {
                local_40 = (double)(int)((uVar21 * 100 + uVar16 * 10 + iVar11) * uVar10);
                dVar27 = pow(-1.0,(double)(int)uVar21);
                local_34[0] = (uint)(dVar27 * local_40);
              }
              __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_68;
              if ((uVar20 & 0xfffffffe) == 2) {
                uVar16 = local_34[0] - 10000;
                bVar23 = (int)local_34[0] < 0;
                local_34[0] = local_34[0] + 10000;
                if (bVar23) {
                  local_34[0] = uVar16;
                }
              }
              if (uVar20 == 4) {
                uVar20 = local_34[0] - 20000;
                bVar23 = (int)local_34[0] < 0;
                local_34[0] = local_34[0] + 20000;
                if (bVar23) {
                  local_34[0] = uVar20;
                }
              }
              uVar22 = (ulong)local_48;
              if (local_34[0] == 0x14b) {
                dVar27 = RLU(psVar15,false);
                if (dVar27 <= PARJ[0x19]) goto LAB_0012a759;
LAB_0012a73b:
                bVar23 = false;
                iVar11 = 5;
                bVar3 = 1;
              }
              else {
                if ((local_34[0] == 0xdd) && (dVar27 = RLU(psVar15,false), PARJ[0x18] < dVar27))
                goto LAB_0012a73b;
LAB_0012a759:
                bVar3 = 0;
                bVar23 = true;
                iVar11 = 0;
              }
              KFL2 = local_4c;
              if (bVar23) goto LAB_0012a769;
            }
            else {
              do {
                if (local_4e == '\0') {
                  uVar10 = (uint)local_170;
                  uVar21 = (uint)local_178;
                  uVar20 = local_f8;
                  uVar16 = local_48;
                  if (10 < local_48) {
                    if (local_4c == 0) {
                      dVar27 = RLU(psVar15,false);
                      local_38 = ~(int)(dVar27 * local_110);
                      if (-1 < local_44) {
                        local_38 = (int)(dVar27 * local_110) + 1;
                      }
                    }
                    uVar16 = -local_38;
                    if (0 < (int)local_38) {
                      uVar16 = local_38;
                    }
                    uVar10 = (uint)local_150;
                    uVar21 = (uint)local_128;
                    uVar20 = local_f4;
                    uVar16 = uVar16 + (uint)local_98;
                  }
                }
                else {
                  do {
                    while( true ) {
                      dVar27 = RLU(psVar15,false);
                      dVar27 = dVar27 * local_70;
                      dVar26 = RLU(psVar15,false);
                      dVar26 = dVar26 * local_70;
                      dVar2 = RLU(psVar15,false);
                      if ((int)dVar26 <= (int)dVar27) break;
                      if (dVar2 * local_b0 <= 1.0) {
                        uVar20 = 1;
                        goto LAB_00129ff6;
                      }
                    }
                  } while (local_b0 < dVar2);
                  uVar20 = 3;
LAB_00129ff6:
                  uVar21 = (int)dVar27 + 1;
                  uVar10 = (int)dVar26 + 1;
                  uVar16 = uVar10;
                  if ((int)uVar10 < (int)uVar21) {
                    uVar16 = uVar21;
                  }
                  uVar7 = uVar21;
                  if ((int)uVar10 < (int)uVar21) {
                    uVar7 = uVar10;
                  }
                  uVar7 = uVar7 * 100 + uVar16 * 1000 | uVar20;
                  uVar16 = local_48;
                  local_38 = -uVar7;
                  if (-1 < local_44) {
                    local_38 = uVar7;
                  }
                }
                uVar7 = (uVar21 != uVar10) + 3 + (uint)(uVar21 != uVar10);
                if (uVar20 != 3) {
                  uVar7 = uVar20;
                }
                uVar22 = (ulong)((uVar16 != uVar10 && uVar16 != uVar21) + uVar7);
                local_40 = PARJ[0x11] * PARF[uVar22 + 0x45] + PARF[uVar22 + 0x3b];
                if ((local_58._0_4_ == 1) && (1 < MSTJ[0xb])) {
                  uVar7 = uVar10;
                  if ((int)uVar10 < (int)uVar21) {
                    uVar7 = uVar21;
                  }
                  dVar27 = local_c8;
                  if (uVar7 != 3) {
                    dVar27 = local_b8;
                  }
                  uVar7 = uVar21;
                  if ((int)uVar10 < (int)uVar21) {
                    uVar7 = uVar10;
                  }
                  uVar24 = SUB84(local_c0,0);
                  uVar25 = (undefined4)((ulong)local_c0 >> 0x20);
                  if (uVar7 != 3) {
                    uVar24 = SUB84(dVar27,0);
                    uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
                  }
                  dVar27 = (double)CONCAT44(uVar25,uVar24);
                  if (uVar20 == 1) {
                    dVar27 = (double)CONCAT44(uVar25,uVar24) / local_120;
                  }
                  if (uVar20 == 1) {
                    local_40 = (local_40 * (dVar27 + 1.0)) / local_158;
                  }
                  if (uVar20 == 3) {
                    local_40 = ((dVar27 + 1.0) * local_40) / local_160;
                  }
                }
              } while ((local_4c == 0) && (dVar27 = RLU(psVar15,false), local_40 < dVar27));
              psVar15 = (sophia_interface *)(uVar22 + 0x3b);
              local_88._4_4_ = uVar21;
              local_88._0_4_ = uVar16;
              local_88._8_4_ = uVar10;
              lVar4 = 4;
              puVar9 = (uint *)local_88;
              do {
                if ((int)*puVar9 < *(int *)(local_88 + lVar4)) {
                  puVar9 = (uint *)(local_88 + lVar4);
                }
                lVar4 = lVar4 + 4;
              } while (lVar4 != 0xc);
              uVar7 = *puVar9;
              lVar4 = 4;
              puVar9 = (uint *)local_88;
              do {
                if (*(int *)(local_88 + lVar4) < (int)*puVar9) {
                  puVar9 = (uint *)(local_88 + lVar4);
                }
                lVar4 = lVar4 + 4;
              } while (lVar4 != 0xc);
              local_40 = (double)(ulong)*puVar9;
              iVar11 = (uVar21 + uVar10 + uVar16) - (*puVar9 + uVar7);
              local_58 = PARJ[0x11] * PARF[uVar22 + 0x45] + PARF[(long)psVar15];
              psVar6 = psVar15;
              dVar27 = RLU(psVar15,false);
              dVar27 = dVar27 * local_58;
              bVar23 = dVar27 != PARF[(long)psVar15];
              bVar1 = PARF[(long)psVar15] <= dVar27;
              psVar15 = (sophia_interface *)CONCAT71((int7)((ulong)psVar6 >> 8),bVar1 && bVar23);
              iVar12 = SUB84(local_40,0);
              if ((bVar1 && bVar23) || ((int)uVar7 <= iVar11)) {
                uVar21 = 0;
              }
              else {
                uVar21 = 0;
                if (iVar12 < iVar11) {
                  uVar21 = (uint)(uVar16 == uVar7 && uVar20 == 1);
                  psVar6 = psVar15;
                  if ((uVar20 == 1) && (uVar16 != uVar7)) {
                    local_58 = (double)(ulong)uVar7;
                    dVar27 = RLU(psVar15,false);
                    psVar6 = (sophia_interface *)((ulong)psVar15 & 0xffffffff);
                    uVar7 = SUB84(local_58,0);
                    uVar21 = (uint)(dVar27 + 0.25);
                  }
                  psVar15 = psVar6;
                  if ((uVar20 == 3) && (uVar16 != uVar7)) {
                    psVar15 = (sophia_interface *)((ulong)psVar6 & 0xffffffff);
                    dVar27 = RLU(psVar6,false);
                    uVar21 = (uint)(dVar27 + 0.75);
                  }
                }
              }
              iVar17 = ((uint)psVar15 & 0xff) * 2 + 2;
              if (uVar21 == 1) {
                uVar20 = iVar12 * 100 + uVar7 * 1000 + iVar11 * 10 + iVar17;
                local_34[0] = -uVar20;
                if (-1 < local_44) {
                  local_34[0] = uVar20;
                }
              }
              else if (uVar21 == 0) {
                uVar20 = uVar7 * 1000 + iVar12 * 10 + iVar11 * 100 + iVar17;
                local_34[0] = -uVar20;
                if (-1 < local_44) {
                  local_34[0] = uVar20;
                }
              }
              bVar3 = 0;
              uVar22 = (ulong)local_48;
              __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_68;
LAB_0012a769:
              KFL2 = local_4c;
              iVar14._M_current = ((sophia_interface *)__return_storage_ptr__)->K[0][1];
              if (iVar14._M_current ==
                  *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 3)) {
                psVar15 = (sophia_interface *)__return_storage_ptr__;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,
                           (int *)&local_38);
              }
              else {
                *iVar14._M_current = local_38;
                *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 1) =
                     iVar14._M_current + 1;
              }
              iVar14._M_current = ((sophia_interface *)__return_storage_ptr__)->K[0][1];
              if (iVar14._M_current ==
                  *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 3)) {
                psVar15 = (sophia_interface *)__return_storage_ptr__;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,
                           (int *)local_34);
                uVar5 = extraout_RAX_00;
              }
              else {
                uVar5 = (ulong)local_34[0];
                *iVar14._M_current = local_34[0];
                *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 1) =
                     iVar14._M_current + 1;
              }
              local_a8 = CONCAT71((int7)(uVar5 >> 8),1);
              iVar11 = 1;
            }
            bVar23 = (bool)(bVar3 ^ 1);
          }
          else {
            uVar21 = uVar20 / 1000 + (uVar20 / 10000) * -10;
            uVar10 = uVar20 / 100 + (uVar20 / 1000) * -10;
            uVar16 = uVar10;
            if (uVar10 < uVar21) {
              uVar16 = uVar21;
            }
            uVar24 = SUB84(local_c8,0);
            uVar25 = (undefined4)((ulong)local_c8 >> 0x20);
            if (uVar16 != 3) {
              uVar24 = SUB84(local_b8,0);
              uVar25 = (undefined4)((ulong)local_b8 >> 0x20);
            }
            if (uVar10 < uVar21) {
              uVar21 = uVar10;
            }
            local_40 = local_c0;
            if (uVar21 != 3) {
              local_40 = (double)CONCAT44(uVar25,uVar24);
            }
            uVar20 = uVar20 * -0x33333333 + 0x33333333;
            if ((uVar20 >> 1 | (uint)((uVar20 & 1) != 0) << 0x1f) < 0x1999999a) {
              local_40 = local_40 / local_120;
            }
            dVar27 = RLU(psVar15,false);
            dVar27 = (local_40 + 1.0) * dVar27;
            iVar11 = local_58._0_4_;
            if (1.0 < dVar27) {
              iVar11 = -1;
            }
            local_58 = (double)CONCAT44(local_58._4_4_,iVar11);
            if (KFL2 != 0 && 1.0 < dVar27) {
              iVar14._M_current = ((sophia_interface *)__return_storage_ptr__)->K[0][1];
              if (iVar14._M_current ==
                  *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 3)) {
                psVar15 = (sophia_interface *)__return_storage_ptr__;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,
                           (int *)&local_38);
                uVar5 = extraout_RAX;
              }
              else {
                uVar5 = (ulong)local_38;
                *iVar14._M_current = local_38;
                *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 1) =
                     iVar14._M_current + 1;
              }
              iVar14._M_current = ((sophia_interface *)__return_storage_ptr__)->K[0][1];
              if (iVar14._M_current ==
                  *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 3)) {
                local_a8 = CONCAT71((int7)(uVar5 >> 8),1);
                psVar15 = (sophia_interface *)__return_storage_ptr__;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,
                           (int *)local_34);
              }
              else {
                *iVar14._M_current = local_34[0];
                *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 1) =
                     iVar14._M_current + 1;
                local_a8 = CONCAT71((uint7)(uint3)(local_34[0] >> 8),1);
              }
            }
            if (KFL2 == 0 || 1.0 >= dVar27) goto LAB_00129f09;
            iVar11 = 1;
            bVar23 = true;
          }
        } while ((iVar11 == 5) && (!bVar23));
        if ((iVar11 != 5) && (iVar11 != 0)) {
          if ((local_a8 & 1) != 0) {
            return (vector<int,_std::allocator<int>_> *)(sophia_interface *)__return_storage_ptr__;
          }
          if (*(void **)__return_storage_ptr__ == (void *)0x0) {
            return (vector<int,_std::allocator<int>_> *)(sophia_interface *)__return_storage_ptr__;
          }
          operator_delete(*(void **)__return_storage_ptr__);
          return (vector<int,_std::allocator<int>_> *)(sophia_interface *)__return_storage_ptr__;
        }
      }
      bVar23 = (MSTJ[0xb] < 2 & local_4d) != 0;
      uVar20 = local_e4;
      if (bVar23 || MSTJ[0xb] < 1 && local_8c == 0) {
        uVar20 = 1;
      }
      uVar16 = local_e8;
      if (bVar23 || MSTJ[0xb] < 1 && local_8c == 0) {
        uVar16 = 6;
      }
      uVar21 = (int)local_118 + uVar20;
      local_70 = 0.0;
      iVar11 = 0;
      do {
        psVar15 = (sophia_interface *)(ulong)uVar21;
        iVar12 = (uVar16 - uVar20) + 1;
        if ((int)uVar20 <= (int)uVar16) {
          do {
            local_70 = local_70 + PARF[(int)psVar15];
            psVar15 = (sophia_interface *)(ulong)((int)psVar15 + 1);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        iVar11 = iVar11 + 1;
        uVar21 = uVar21 + 0x19;
      } while (iVar11 != 3);
      dVar27 = RLU(psVar15,false);
      KFL2 = local_4c;
      __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_68;
      dVar27 = local_70 * dVar27;
      iVar11 = (int)local_138 + uVar20;
      uVar10 = 0;
      uVar21 = 0;
      do {
        uVar7 = uVar21;
        bVar23 = (int)uVar16 < (int)uVar20;
        if ((int)uVar20 <= (int)uVar16) {
          dVar27 = dVar27 - PARF[(int)(uVar7 * 0x19 + (int)local_118 + uVar20)];
          uVar10 = uVar20;
          if (0.0 < dVar27) {
            lVar4 = 0;
            do {
              if ((uVar20 - uVar16) + (int)lVar4 == 0) {
                uVar10 = uVar16;
                bVar23 = (long)(int)uVar16 <= lVar4 + (int)uVar20;
                goto LAB_0012a934;
              }
              dVar27 = dVar27 - PARF[iVar11 + (int)lVar4];
              lVar4 = lVar4 + 1;
            } while (0.0 < dVar27);
            uVar10 = (int)lVar4 + uVar20;
            bVar23 = (long)(int)uVar16 <= (int)uVar20 + lVar4 + -1;
          }
        }
LAB_0012a934:
        if (!bVar23) break;
        iVar11 = iVar11 + 0x19;
        uVar21 = uVar7 + 1;
      } while (uVar7 < 2);
      if ((int)uVar10 < 7) {
        uVar21 = -uVar10;
        if (-1 < local_dc) {
          uVar21 = uVar10;
        }
        uVar16 = 0;
        uVar20 = uVar10;
      }
      else {
        uVar20 = (uVar10 != 7) + 1;
        if (10 < (int)uVar10) {
          uVar20 = 3;
        }
        if (0xf < (int)uVar10) {
          uVar20 = 4;
        }
        iVar12 = (uVar20 - 2) * uVar20;
        iVar11 = uVar10 - iVar12;
        uVar16 = (iVar11 - (iVar11 + -6 >> 0x1f)) + -6 >> 1;
        local_38 = uVar16 * 100 + uVar20 * 1000 + 1;
        if ((uVar20 == uVar16) || (uVar10 != iVar12 + uVar16 * 2 + 6)) {
          local_38 = uVar16 * 100 + uVar20 * 1000 | 3;
        }
        uVar21 = -local_38;
        if (-1 < local_e0) {
          uVar21 = local_38;
        }
      }
      uVar22 = (ulong)local_48;
      uVar18 = (uint)local_108;
      psVar15 = (sophia_interface *)local_1c0;
      uVar13 = (uint)local_140;
      local_38 = uVar21;
      if (((uVar20 == uVar18) && (uVar16 == (uint)local_a0)) && (((int)uVar20 < 4 || (uVar16 != 0)))
         ) {
        dVar27 = RLU(psVar15,false);
        iVar12 = uVar7 * 0x19;
        iVar11 = (int)local_130;
        dVar26 = PARF[iVar11 + 0x8f + iVar12] + PARF[iVar11 + iVar12 + 0x8e];
        dVar27 = (PARF[iVar11 + 0x90 + iVar12] + dVar26) * dVar27;
        if ((PARF[iVar11 + iVar12 + 0x8e] < dVar27) ||
           (local_34[0] = uVar7 * 2 + 0x6f, dVar26 < dVar27)) {
          local_34[0] = uVar7 * 2 + 0x14b;
          if (dVar27 <= dVar26) {
            local_34[0] = uVar7 * 2 + 0xdd;
          }
        }
LAB_0012ac98:
        if (KFL2 != 0) {
          local_38 = 0;
        }
        iVar11 = LUCOMP(psVar15,local_34[0]);
        if (iVar11 != 0) goto LAB_0012ad54;
        local_1a0._0_8_ = local_1a0 + 0x10;
        psVar15 = (sophia_interface *)local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"LUKFDI: user-defined flavour probabilities failed","");
        LUERRM(psVar15,2,(string *)local_1a0);
        psVar6 = (sophia_interface *)(local_1a0 + 0x10);
        psVar15 = (sophia_interface *)local_1a0._0_8_;
      }
      else {
        if (((int)uVar13 < 7) && ((int)uVar10 < 7)) {
          uVar20 = uVar10;
          if ((int)uVar13 <= (int)uVar10) {
            uVar20 = uVar13;
            uVar13 = uVar10;
          }
          iVar12 = uVar13 * 100 + uVar20 * 10 + uVar7 * 2 + 1;
          iVar11 = -iVar12;
          if ((uVar13 == local_48) == -1 < local_44) {
            iVar11 = iVar12;
          }
LAB_0012ac7f:
          local_70 = (double)iVar11;
          dVar27 = pow(-1.0,(double)(int)uVar13);
          local_34[0] = (int)(dVar27 * local_70);
          goto LAB_0012ac98;
        }
        if (((int)uVar13 < 7) || ((int)uVar10 < 7)) {
          local_88._0_4_ = uVar18;
          local_88._4_4_ = uVar20;
          if (6 < (int)uVar13) {
            uVar16 = (uint)local_a0;
            local_88._0_4_ = uVar20;
            local_88._4_4_ = uVar18;
          }
          local_88._8_4_ = uVar16;
          lVar4 = 4;
          piVar19 = (int *)local_88;
          do {
            if (*piVar19 < *(int *)(local_88 + lVar4)) {
              piVar19 = (int *)(local_88 + lVar4);
            }
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0xc);
          lVar4 = 4;
          psVar15 = (sophia_interface *)local_88;
          do {
            if (*(int *)(local_88 + lVar4) < psVar15->N) {
              psVar15 = (sophia_interface *)(local_88 + lVar4);
            }
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0xc);
          iVar11 = psVar15->N;
          iVar12 = ((uVar20 + uVar18 + uVar16) - *piVar19) - iVar11;
          iVar17 = *piVar19 * 1000;
          if (uVar7 == 0) {
            iVar17 = iVar11 * 100 + iVar17;
            local_34[0] = iVar17 + 2 + iVar12 * 10;
            if (local_44 < 0) {
              local_34[0] = -(iVar17 + iVar12 * 10) - 2;
            }
          }
          else {
            uVar20 = iVar17 + uVar7 * 2 + iVar11 * 10 + iVar12 * 100;
            local_34[0] = -uVar20;
            if (-1 < local_44) {
              local_34[0] = uVar20;
            }
          }
          goto LAB_0012ac98;
        }
        uVar21 = (uint)local_a0;
        if (uVar20 == uVar18) {
          uVar13 = uVar16;
          if ((int)uVar16 < (int)(uint)local_a0) {
            uVar13 = (uint)local_a0;
            uVar21 = uVar16;
          }
          uVar10 = local_5c;
          if ((int)(uint)local_a0 < (int)uVar16) {
            uVar10 = local_60;
          }
LAB_0012ac5a:
          iVar11 = (uVar7 * 2 + uVar21 * 10 + uVar13 * 100 + 1) * uVar10;
          goto LAB_0012ac7f;
        }
        uVar13 = uVar20;
        uVar10 = local_60;
        if ((uVar18 == uVar16) ||
           (uVar21 = uVar16, uVar13 = uVar18, uVar10 = local_5c, (uint)local_a0 == uVar20))
        goto LAB_0012ac5a;
        if ((uint)local_a0 == uVar16) {
          uVar13 = uVar20;
          uVar21 = uVar18;
          if ((int)uVar20 < (int)uVar18) {
            uVar13 = uVar18;
            uVar21 = uVar20;
          }
          if ((int)uVar18 < (int)uVar20) {
            uVar10 = local_60;
          }
          goto LAB_0012ac5a;
        }
        local_1c0[0] = (sophia_interface *)local_1b0;
        psVar6 = psVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar15,"LUKFDI: no matching flavours for qq -> qq","");
        LUERRM(psVar6,2,(string *)psVar15);
        psVar6 = (sophia_interface *)local_1b0;
        psVar15 = local_1c0[0];
      }
      uVar20 = 1;
      if (psVar15 != psVar6) {
        operator_delete(psVar15);
        uVar20 = 1;
      }
      goto LAB_00129a66;
    }
    if (KFL2 * KFL1 < 1 || (10 < local_f8 || 10 < local_48)) {
      if (local_f8 < 0xb || local_48 < 0xb) {
        if (-1 < KFL2 * KFL1 || local_48 < 0xb && local_f8 < 0xb) goto LAB_00129691;
        iVar14._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current !=
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00129664;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)&local_38
                  );
      }
      else {
        iVar14._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current !=
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00129664;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)&local_38
                  );
      }
    }
    else {
      iVar14._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)&local_38
                  );
      }
      else {
LAB_00129664:
        *iVar14._M_current = 0;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      }
    }
  }
  iVar14._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)local_34);
    return __return_storage_ptr__;
  }
LAB_0012ad83:
  *iVar14._M_current = local_34[0];
  *(uint **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 1) = (uint *)iVar14._M_current + 1
  ;
  return (vector<int,_std::allocator<int>_> *)(sophia_interface *)__return_storage_ptr__;
LAB_0012ad54:
  iVar14._M_current = ((sophia_interface *)__return_storage_ptr__)->K[0][1];
  if (iVar14._M_current == *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 3)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)&local_38);
  }
  else {
    *iVar14._M_current = local_38;
    *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 1) = iVar14._M_current + 1;
  }
  iVar14._M_current = ((sophia_interface *)__return_storage_ptr__)->K[0][1];
  if (iVar14._M_current == *(int **)(((sophia_interface *)__return_storage_ptr__)->K[0] + 3)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar14,(int *)local_34);
    return (vector<int,_std::allocator<int>_> *)(sophia_interface *)__return_storage_ptr__;
  }
  goto LAB_0012ad83;
}

Assistant:

std::vector<int> sophia_interface::LUKFDI(int KFL1, int KFL2) {
// Purpose: to generate a new flavour pair and combine off a hadron.
// Default flavour values. Input consistency checks.
// Returns vector (KFL3, KF).
    int KFL3 = 0;
    int KF = 0;
    std::vector<int> output;
    int KF1A = std::abs(KFL1);
    int KF2A = std::abs(KFL2);
    if (KF1A == 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    if (KF2A != 0) {
        if (KF1A <= 10 && KF2A <= 10 && KFL1 * KFL2 > 0) {output.push_back(KFL3); output.push_back(KF); return output;}
        if (KF1A > 10 && KF2A > 10) {output.push_back(KFL3); output.push_back(KF); return output;}
        if ((KF1A > 10 || KF2A > 10) && KFL1 * KFL2 < 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    }

    // Check if tabulated flavour probabilities are to be used. 
    bool skip = false;
    int KTAB1 = 0;
    int KTAB2 = 0;
    int KFL1A = 0;
    int KFL1B = 0;
    if (MSTJ[14] == 1) {
        KTAB1 = -1;
        if ((KF1A >= 1) && (KF1A <= 6)) KTAB1 = KF1A;
        KFL1A = (KF1A / 1000) % 10;
        KFL1B = (KF1A / 100) % 10;
        int KFL1S = KF1A % 10;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1B >= 1 && KFL1B <= 4) KTAB1 = 6 + KFL1A * (KFL1A - 2) + 2 * KFL1B + (KFL1S - 1) / 2;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1A == KFL1B) KTAB1--;
        if (KF1A >= 1 && KF1A <= 6) KFL1A = KF1A;
        KTAB2 = 0;
        if (KF2A != 0) {
            KTAB2 = -1;
            if (KF2A >= 1 && KF2A <= 6) KTAB2 = KF2A;
            int KFL2A = (KF2A / 1000) % 10;
            int KFL2B = (KF2A / 100) % 10;
            int KFL2S = KF2A % 10;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2B >= 1 && KFL2B <= 4) KTAB2 = 6 + KFL2A * (KFL2A - 2) + 2 * KFL2B + (KFL2S - 1) / 2;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2A == KFL2B) KTAB2--;
        }
        if (KTAB1 >= 0 && KTAB2 >= 0) skip = true;
    }

    // Parameters and breaking diquark parameter combinations.
    int KFL3A = 0;
    int KFLA = 0;
    int KFLB = 0;
    int KFLC = 0; 
    int KFS = 0;       
    bool repeat100 = false;
    do {
        repeat100 = false;
        if (skip == false) {
            double PAR2 = PARJ[1];
            double PAR3 = PARJ[2];
            double PAR4 = 3. * PARJ[3];
            double PAR3M = 0.;
            double PAR4M = 0.;
            double PARDM = 0.;
            double PARS0 = 0.;
            double PARS1 = 0.;
            double PARS2 = 0.;
            double PARSM = 0.;
            if (MSTJ[11] >= 2) {
                PAR3M = std::sqrt(PARJ[2]);
                PAR4M = 1. / (3. * std::sqrt(PARJ[3]));
                PARDM = PARJ[6] / (PARJ[6] + PAR3M * PARJ[5]);
                PARS0 = PARJ[4] * (2. + (1. + PAR2 * PAR3M * PARJ[6]) * (1. + PAR4M));
                PARS1 = PARJ[6] * PARS0 / (2. * PAR3M) + PARJ[4] * (PARJ[5] * (1. + PAR4M) + PAR2 * PAR3M * PARJ[5] * PARJ[6]);
                PARS2 = PARJ[4] * 2. * PARJ[5] * PARJ[6] * (PAR2 * PARJ[6] + (1. + PAR4M) / PAR3M);
                PARSM = std::max({PARS0, PARS1, PARS2});
                PAR4 = PAR4 * (1. + PARSM) / (1. + PARSM / (3. * PAR4M));
            }
     
            // Choice of whether to generate meson or baryon. 
            bool repeat110 = false;
            do {
                repeat110 = false;
                int MBARY = 0;
                int KFDA = 0;
                if (KF1A <= 10) {
                    if (KF2A == 0 && MSTJ[11] >= 1 && ((1. + PARJ[0]) * RLU()) > 1.) MBARY = 1;
                    if (KF2A > 10) MBARY = 2;
                    if (KF2A > 10 && KF2A <= 10000) KFDA = KF2A;
                } else {
                    MBARY = 2;
                    if (KF1A <= 10000) KFDA = KF1A;
                }

                // Possibility of process diquark -> meson + new diquark. 
                int KFLDS = 0;     
                if (KFDA != 0 && MSTJ[11] >= 2) {
                    int KFLDA = (KFDA / 1000) % 10;
                    int KFLDB = (KFDA / 100) % 10;
                    KFLDS = KFDA % 10;
                    double WTDQ = PARS0;
                    if (std::max(KFLDA, KFLDB) == 3) WTDQ = PARS1;
                    if (std::min(KFLDA, KFLDB) == 3) WTDQ = PARS2;
                    if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                    if ((1. + WTDQ) * RLU() > 1.) MBARY = -1;
                    if (MBARY == -1 && KF2A != 0) {output.push_back(KFL3); output.push_back(KF); return output;}
                }
         
                // Flavour for meson, possibly with new flavour. 
                int KFLS = 0;
                if (MBARY <= 0) {
                    KFS = (KFL1 < 0)? -1 : 1;
                    if (MBARY == 0) {
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        if (KF2A == 0) KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                        KFLA = std::max(KF1A, KF2A + std::abs(KFL3));
                        KFLB = std::min(KF1A, KF2A + std::abs(KFL3));
                        if (KFLA != KF1A) KFS = -KFS;
         
                    // Splitting of diquark into meson plus new diquark. 
                    } else {
                        int KFL1A = (KF1A / 1000) % 10;
                        int KFL1B = (KF1A / 100) % 10;
                        int KFL1D = 0;
                        int KFL1E = 0;
                        do {
                            KFL1D =  KFL1A + static_cast<int>(RLU() + 0.5) * (KFL1B - KFL1A);
                            KFL1E =  KFL1A + KFL1B - KFL1D;
                            if ((KFL1D == 3 && RLU() > PARDM) || (KFL1E == 3 && RLU() < PARDM)) {
                                KFL1D = KFL1A + KFL1B - KFL1D;
                                KFL1E = KFL1A + KFL1B - KFL1E;
                            }
                            KFL3A = 1 + static_cast<int>((2. + PAR2 * PAR3M * PARJ[6]) * RLU());
                        } while ((KFL1E != KFL3A && (RLU() > (1. + PAR4M) / std::max(2., 1. + PAR4M))) || (KFL1E == KFL3A && (RLU() > 2. / std::max(2., 1. + PAR4M))));
                        KFLDS = 3;
                        if (KFL1E != KFL3A) KFLDS = 2 * static_cast<int>(RLU() + 1. / (1. + PAR4M)) + 1;
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        KFL3 = (10000 + 1000 * std::max(KFL1E, KFL3A) + 100 * std::min(KFL1E, KFL3A) + KFLDS) * sgn;
                        KFLA = std::max(KFL1D, KFL3A);
                        KFLB = std::min(KFL1D, KFL3A);
                        if (KFLA != KFL1D) KFS = -KFS;
                    }
         
                    // Form meson, with spin and flavour mixing for diagonal states. 
                    int KMUL = 0;
                    if (KFLA <= 2) KMUL = static_cast<int>(PARJ[10] + RLU());
                    if (KFLA == 3) KMUL = static_cast<int>(PARJ[11] + RLU());
                    if (KFLA >= 4) KMUL = static_cast<int>(PARJ[12] + RLU());
                    if (KMUL == 0 && PARJ[13] > 0.) {
                        if (RLU() < PARJ[13]) KMUL = 2;
                    } else if (KMUL == 1 && PARJ[14] + PARJ[15] + PARJ[16] > 0.) {
                        double RMUL = RLU();
                        if (RMUL < PARJ[14]) KMUL = 3;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15]) KMUL = 4;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15] + PARJ[16]) KMUL = 5;
                    }
                    KFLS = 3;
                    if (KMUL == 0 || KMUL == 3) KFLS = 1;
                    if (KMUL == 5) KFLS = 5;
                    if (KFLA != KFLB) {
                        KF = (100 * KFLA + 10 * KFLB + KFLS) * KFS * std::pow(-1, KFLA);
                    } else {
                        double RMIX = RLU();
                        int IMIX = 2 * KFLA + 10 * KMUL;
                        if (KFLA <= 3) KF = 110 * (1 + static_cast<int>(RMIX + PARF[IMIX - 2]) + static_cast<int>(RMIX + PARF[IMIX - 1])) + KFLS;
                        if (KFLA >= 4) KF = 110 * KFLA + KFLS;
                    }
                    if (KMUL == 2 || KMUL == 3) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 10000 * sgn;
                    }
                    if (KMUL == 4) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 20000 * sgn;
                    }

                    // Optional extra suppression of eta and eta'.
                    if (KF == 221) {
                        if (RLU() > PARJ[24]) {repeat110 = true; continue;}
                    } else if (KF == 331) {
                        if (RLU() > PARJ[25]) {repeat110 = true; continue;}
                    }

                // Generate diquark flavour.
                } else {
                    double WT = 0.;
                    int KBARY = 0.;
                    do {
                        if (KF1A <= 10 && KF2A == 0) {
                            KFLA = KF1A;
                            do {
                                KFLB = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLC = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLDS = 1;
                                if (KFLB >= KFLC) KFLDS = 3;
                            } while ((KFLDS == 1 && PAR4 * RLU() > 1.) || (KFLDS == 3 && PAR4 < RLU()));
                            int sgn = (KFL1 < 0)? -1 : 1;
                            KFL3 = (1000 * std::max(KFLB, KFLC) + 100 * std::min(KFLB, KFLC) + KFLDS) * sgn;

                        // Take diquark flavour from input. 
                        } else if (KF1A <= 10) {
                            KFLA = KF1A;
                            KFLB = (KF2A / 1000) % 10;
                            KFLC = (KF2A / 100) % 10;
                            KFLDS = KF2A % 10;

                        // Generate (or take from input) quark to go with diquark. 
                        } else {
                            if (KF2A == 0) {
                                int sgn = (KFL1 < 0)? -1 : 1;
                                KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                            }
                            KFLA = KF2A + std::abs(KFL3);
                            KFLB = (KF1A / 1000) % 10;
                            KFLC = (KF1A / 100) % 10;
                            KFLDS = KF1A % 10;
                        }

                        // SU(6) factors for formation of baryon. Try again if fails. 
                        KBARY = KFLDS;
                        if (KFLDS == 3 && KFLB != KFLC) KBARY = 5;
                        if (KFLA != KFLB && KFLA != KFLC) KBARY++;
                        WT = PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY];
                        if (MBARY == 1 && MSTJ[11] >= 2) {
                            double WTDQ = PARS0;
                            if (std::max(KFLB, KFLC) == 3) WTDQ = PARS1;
                            if (std::min(KFLB, KFLC) == 3) WTDQ = PARS2;
                            if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                            if (KFLDS == 1) WT = WT * (1. + WTDQ) / (1. + PARSM / (3. * PAR4M));
                            if (KFLDS == 3) WT = WT * (1. + WTDQ) / (1. + PARSM);
                        }
                    } while (KF2A == 0 && WT < RLU());

                    // Form baryon. Distinguish Lambda- and Sigmalike baryons. 
                    int KFLD = std::max({KFLA, KFLB, KFLC});
                    int KFLF = std::min({KFLA, KFLB, KFLC});
                    int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
                    KFLS = 2;
                    if ((PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY]) * RLU() > PARF[59 + KBARY]) KFLS = 4;
                    int KFLL = 0;
                    if (KFLS == 2 && KFLD > KFLE && KFLE > KFLF) {
                        if (KFLDS == 1 && KFLA == KFLD) KFLL = 1;
                        if (KFLDS == 1 && KFLA != KFLD) KFLL = static_cast<int>(0.25 + RLU());
                        if (KFLDS == 3 && KFLA != KFLD) KFLL = static_cast<int>(0.75 + RLU());
                    }
                    if (KFLL == 0) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + KFLS) * sgn;
                    }
                    if (KFLL == 1) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + KFLS) * sgn;
                    }
                }

                output.push_back(KFL3);
                output.push_back(KF);
                return output;
            } while (repeat110);
        }  // end skip condition
        skip = false;

        // Use tabulated probabilities to select new flavour and hadron.
        int KT3L = KTAB2;
        int KT3U = KTAB2;
        if (KTAB2 == 0 && MSTJ[11] <= 0) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0 && KTAB1 >= 7 && MSTJ[11] <= 1) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0) {
            KT3L = 1;
            KT3U = 22;
        }
        double RFL = 0.;
        for (int KTS = 0; KTS < 3; ++KTS) {
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                RFL += PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
            }
        }
        RFL *= RLU();
        int KTABS = 0;
        int KTAB3 = 0;
        for (int KTS = 0; KTS < 3; ++KTS) {
            KTABS = KTS;
            bool breakLoop = false;
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                KTAB3 = KT3;
                RFL -= PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
                if (RFL <= 0.) {breakLoop = true; break;}
            }
            if (breakLoop) break;
        }

        // Reconstruct flavour of produced quark/diquark.
        int KFL3B = 0;
        if (KTAB3 <= 6) {
            KFL3A = KTAB3;
            KFL3B = 0;
            int sgn = (KFL1 * (2 * KTAB1 - 13) < 0)? -1 : 1;
            KFL3 = KFL3A * sgn;
        } else {
            KFL3A = 1;
            if (KTAB3 >= 8) KFL3A = 2;
            if (KTAB3 >= 11) KFL3A = 3;
            if (KTAB3 >= 16) KFL3A = 4;
            KFL3B = (KTAB3 - 6 - KFL3A * (KFL3A - 2)) / 2;
            KFL3 = 1000 * KFL3A + 100 * KFL3B + 1;
            if (KFL3A == KFL3B || KTAB3 != 6 + KFL3A * (KFL3A - 2) + 2 * KFL3B) KFL3 += 2;
            int sgn = (KFL1 * (13 - 2 * KTAB1) < 0)? -1 : 1;
            KFL3 = KFL3 * sgn;
        }

        // Reconstruct meson code. 
        if (KFL3A == KFL1A && KFL3B == KFL1B && (KFL3A <= 3 || KFL3B != 0)) {
            RFL = RLU() * (PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS -1] + PARF[145 + 80 * KTAB1 + 25 * KTABS - 1]);
            KF = 110 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 220 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 330 + 2 * KTABS + 1;
        } else if (KTAB1 <= 6 && KTAB3 <= 6) {
            KFLA = std::max(KTAB1, KTAB3);
            KFLB = std::min(KTAB1, KTAB3);
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFLA != KF1A) KFS = -KFS;
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);
        } else if (KTAB1 >= 7 && KTAB3 >= 7) {
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFL1A == KFL3A) {
                KFLA = std::max(KFL1B, KFL3B);
                KFLB = std::min(KFL1B, KFL3B);
                if (KFLA != KFL1B) KFS = -KFS;
            } else if (KFL1A == KFL3B) {
                KFLA = KFL3A;
                KFLB = KFL1B;
                KFS = -KFS;
            } else if (KFL1B == KFL3A) {
                KFLA = KFL1A;
                KFLB = KFL3B;
            } else if (KFL1B == KFL3B) {
                KFLA = std::max(KFL1A, KFL3A);
                KFLB = std::min(KFL1A, KFL3A);
                if (KFLA != KFL1A) KFS = -KFS;
            } else {
                LUERRM(2, "LUKFDI: no matching flavours for qq -> qq");
                repeat100 = true;
                continue;
            } 
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);

        // Reconstruct baryon code.
        } else {
            if (KTAB1 >= 7) {
                KFLA = KFL3A;
                KFLB = KFL1A;
                KFLC = KFL1B;
            } else {
                KFLA = KFL1A;
                KFLB = KFL3A;
                KFLC = KFL3B;
            }
            int KFLD = std::max({KFLA, KFLB, KFLC});
            int KFLF = std::min({KFLA, KFLB, KFLC});
            int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
            if (KTABS == 0) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + 2) * sgn;
            }
            if (KTABS >= 1) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + 2 * KTABS) * sgn;
            }
        }

        // Check that constructed flavour code is an allowed one.
        if (KFL2 != 0) KFL3 = 0;
        int KC = LUCOMP(KF);
        if (KC == 0) {
            LUERRM(2, "LUKFDI: user-defined flavour probabilities failed");
            repeat100 = true;
            continue;
        }
    } while (repeat100);
    
    output.push_back(KFL3);
    output.push_back(KF);
    return output;
}